

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O1

ReadFileResult anon_unknown.dwarf_21afabb::ResourceIdHelper(string *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  RegularExpressionMatch match;
  Value *local_f8;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0);
  cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::String
            ((cmJSONHelper<std::string,_cmCTestResourceSpec::ReadFileResult> *)&local_d0,READ_OK,
             INVALID_RESOURCE,&local_f0);
  local_f8 = value;
  if (local_c0 != (code *)0x0) {
    RVar2 = (*local_b8)(&local_d0,out,&local_f8);
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (RVar2 == READ_OK) {
      memset(&local_d0,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::IdRegex,(out->_M_dataplus)._M_p
                         ,(RegularExpressionMatch *)&local_d0);
      RVar2 = (uint)!bVar1 + (uint)!bVar1 * 8;
    }
    return RVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCTestResourceSpec::ReadFileResult ResourceIdHelper(std::string& out,
                                                     const Json::Value* value)
{
  auto result = JSONHelperBuilder::String(
    cmCTestResourceSpec::ReadFileResult::READ_OK,
    cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE)(out, value);
  if (result != cmCTestResourceSpec::ReadFileResult::READ_OK) {
    return result;
  }
  cmsys::RegularExpressionMatch match;
  if (!IdRegex.find(out.c_str(), match)) {
    return cmCTestResourceSpec::ReadFileResult::INVALID_RESOURCE;
  }
  return cmCTestResourceSpec::ReadFileResult::READ_OK;
}